

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_collection.cpp
# Opt level: O1

void __thiscall
duckdb::WindowCollection::GetCollection
          (WindowCollection *this,idx_t row_idx,ColumnDataCollectionSpec *spec)

{
  unsigned_long uVar1;
  BufferManager *buffer_manager;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> _Var2;
  int iVar3;
  ColumnDataCollection *this_00;
  __normal_iterator<std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>
  __position;
  templated_unique_single_t collection;
  Range probe;
  _Head_base<0UL,_duckdb::ColumnDataCollection_*,_false> local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  if (((spec->second).ptr != (ColumnDataCollection *)0x0) &&
     (uVar1 = spec->first,
     optional_ptr<duckdb::ColumnDataCollection,_true>::CheckValid(&spec->second),
     uVar1 + ((spec->second).ptr)->count == row_idx)) {
    return;
  }
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar3 == 0) {
    buffer_manager = this->buffer_manager;
    this_00 = (ColumnDataCollection *)operator_new(0x70);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
              (&local_48,
               &(this->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ColumnDataCollection::ColumnDataCollection
              (this_00,buffer_manager,(vector<duckdb::LogicalType,_true> *)&local_48);
    local_50._M_head_impl = this_00;
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
    spec->first = row_idx;
    (spec->second).ptr = local_50._M_head_impl;
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((long)(this->collections).
                         super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->collections).
                         super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
    local_48.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)row_idx;
    __position = ::std::
                 __upper_bound<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,unsigned_long>*,std::vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>,std::pair<unsigned_long,unsigned_long>,__gnu_cxx::__ops::_Val_less_iter>
                           ((this->ranges).
                            super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            .
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (this->ranges).
                            super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            .
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_48);
    ::std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::insert(&(this->ranges).
              super_vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ,(const_iterator)__position._M_current,(value_type *)&local_48);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>,std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,std::default_delete<duckdb::ColumnDataCollection>,true>>>
                *)&this->collections,
               (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                *)&local_50);
    _Var2._M_head_impl = local_50._M_head_impl;
    if (local_50._M_head_impl != (ColumnDataCollection *)0x0) {
      ColumnDataCollection::~ColumnDataCollection(local_50._M_head_impl);
      operator_delete(_Var2._M_head_impl);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

void WindowCollection::GetCollection(idx_t row_idx, ColumnDataCollectionSpec &spec) {
	if (spec.second && row_idx == spec.first + spec.second->Count()) {
		return;
	}

	lock_guard<mutex> collection_guard(lock);

	auto collection = make_uniq<ColumnDataCollection>(buffer_manager, types);
	spec = {row_idx, collection.get()};
	Range probe {row_idx, collections.size()};
	auto i = std::upper_bound(ranges.begin(), ranges.end(), probe);
	ranges.insert(i, probe);
	collections.emplace_back(std::move(collection));
}